

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O2

void av1_filter_intra_predictor_sse4_1
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint7 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  long lVar11;
  uint8_t *puVar12;
  uint *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i local_128;
  undefined1 local_118 [16];
  __m128i taps_6_7;
  __m128i taps_2_3;
  __m128i taps_0_1;
  ulong uStack_d0;
  __m128i taps_4_5;
  ulong local_88;
  
  if ((0x2021UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    uVar10 = (ulong)(uint)((int)CONCAT71(in_register_00000011,tx_size) << 2);
    iVar2 = *(int *)((long)tx_size_wide + uVar10);
    lVar8 = (long)iVar2;
    iVar3 = *(int *)((long)tx_size_high + uVar10);
    taps_0_1[0] = *(longlong *)av1_filter_intra_taps[mode];
    taps_0_1[1] = *(longlong *)(av1_filter_intra_taps[mode] + 1);
    taps_2_3[0] = *(longlong *)(av1_filter_intra_taps[mode] + 2);
    taps_2_3[1] = *(longlong *)(av1_filter_intra_taps[mode] + 3);
    taps_4_5[0] = *(longlong *)(av1_filter_intra_taps[mode] + 4);
    taps_4_5[1] = *(longlong *)(av1_filter_intra_taps[mode] + 5);
    taps_6_7[0] = *(longlong *)(av1_filter_intra_taps[mode] + 6);
    taps_6_7[1] = *(longlong *)(av1_filter_intra_taps[mode] + 7);
    local_118 = ZEXT416(*(uint *)left) << 0x40;
    auVar14._8_4_ = *(uint *)left;
    auVar14._0_8_ = *(undefined8 *)(above + -1);
    auVar14._12_4_ = 0;
    local_128 = (__m128i)pshufb(auVar14,_DAT_004bb7c0);
    filter_4x2_sse4_1(dst,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
    auVar15 = pshufb(ZEXT416(*(uint *)(dst + stride)),_DAT_004bb7a0);
    auVar16 = pshufb(local_118,_DAT_004bb7d0);
    local_128 = (__m128i)(auVar16 | auVar15);
    puVar12 = dst + stride * 2;
    filter_4x2_sse4_1(puVar12,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
    lVar9 = 3;
    while (lVar9 < lVar8 + -4) {
      local_118._0_8_ = lVar9 + 4;
      uVar4 = CONCAT16(dst[lVar9 + stride],
                       CONCAT15(dst[lVar9],CONCAT14(above[lVar9 + 4],*(undefined4 *)(above + lVar9))
                               ));
      local_128[1]._0_4_ = *(undefined4 *)(above + lVar9);
      local_128[0] = (ulong)uVar4;
      local_128[1]._4_3_ = (int3)(uVar4 >> 0x20);
      local_128[1]._7_1_ = 0;
      filter_4x2_sse4_1(dst + lVar9 + 1,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
      uVar4 = CONCAT16(dst[lVar9 + stride * 3],
                       CONCAT15(puVar12[lVar9],
                                CONCAT14(dst[lVar9 + stride + 4],
                                         *(undefined4 *)(dst + lVar9 + stride))));
      local_128[1]._0_4_ = *(undefined4 *)(dst + lVar9 + stride);
      local_128[0] = (ulong)uVar4;
      local_128[1]._4_3_ = (int3)(uVar4 >> 0x20);
      local_128[1]._7_1_ = 0;
      filter_4x2_sse4_1(puVar12 + lVar9 + 1,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,
                        &taps_6_7);
      lVar9 = local_118._0_8_;
    }
    lVar1 = stride * 4;
    lVar5 = stride * 5 - lVar8;
    lVar6 = lVar5 + 7;
    lVar7 = stride * 3 - lVar8;
    puVar12 = dst + lVar9 + -3;
    for (lVar9 = 4; lVar9 < iVar3; lVar9 = lVar9 + 4) {
      lVar11 = lVar1 - lVar8;
      local_118 = pshufb(ZEXT516(CONCAT14(left[lVar9 + 3],*(uint *)(left + lVar9 + -1))) << 0x40,
                         _DAT_004bb7f0);
      local_128 = (__m128i)pshufb(ZEXT416(*(uint *)(left + lVar9 + -1)) << 0x40 |
                                  ZEXT416(*(uint *)(puVar12 + (4 - stride) + lVar11)),_DAT_004bb7e0)
      ;
      filter_4x2_sse4_1(puVar12 + (lVar1 - lVar8) + 4,stride,&local_128,&taps_0_1,&taps_2_3,
                        &taps_4_5,&taps_6_7);
      auVar15 = pshufb(ZEXT416(*(uint *)(puVar12 + stride + 4 + lVar11)),_DAT_004bb7e0);
      local_128 = (__m128i)(auVar15 | local_118);
      filter_4x2_sse4_1(puVar12 + stride * 2 + 4 + lVar11,stride,&local_128,&taps_0_1,&taps_2_3,
                        &taps_4_5,&taps_6_7);
      local_118._0_8_ = puVar12 + (lVar1 - lVar8);
      for (lVar11 = 0; (int)lVar11 + 4 < iVar2; lVar11 = lVar11 + 4) {
        uVar4 = CONCAT16(puVar12[lVar11 + lVar6],
                         CONCAT15(*(undefined1 *)(local_118._0_8_ + lVar11 + 7),
                                  CONCAT14(puVar12[lVar11 + lVar7 + 0xb],
                                           *(undefined4 *)(puVar12 + lVar11 + lVar7 + 7))));
        local_128[1]._0_4_ = *(undefined4 *)(puVar12 + lVar11 + lVar7 + 7);
        local_128[0] = (ulong)uVar4;
        local_128[1]._4_3_ = (int3)(uVar4 >> 0x20);
        local_128[1]._7_1_ = 0;
        filter_4x2_sse4_1((uint8_t *)(local_118._0_8_ + lVar11 + 8),stride,&local_128,&taps_0_1,
                          &taps_2_3,&taps_4_5,&taps_6_7);
        uVar4 = CONCAT16(puVar12[lVar11 + (stride * 7 - lVar8) + 7],
                         CONCAT15((puVar12 + lVar11 + (stride * 6 - lVar8) + 8)[-1],
                                  CONCAT14(puVar12[lVar11 + lVar5 + 0xb],
                                           *(undefined4 *)(puVar12 + lVar11 + lVar6))));
        local_128[1]._0_4_ = *(undefined4 *)(puVar12 + lVar11 + lVar6);
        local_128[0] = (ulong)uVar4;
        local_128[1]._4_3_ = (int3)(uVar4 >> 0x20);
        local_128[1]._7_1_ = 0;
        filter_4x2_sse4_1(puVar12 + lVar11 + (stride * 6 - lVar8) + 8,stride,&local_128,&taps_0_1,
                          &taps_2_3,&taps_4_5,&taps_6_7);
      }
      puVar12 = (uint8_t *)(local_118._0_8_ + lVar11 + 4);
    }
  }
  else {
    taps_0_1[0] = *(longlong *)av1_filter_intra_taps[mode];
    taps_0_1[1] = *(longlong *)(av1_filter_intra_taps[mode] + 1);
    taps_2_3[0] = *(longlong *)(av1_filter_intra_taps[mode] + 2);
    taps_2_3[1] = *(longlong *)(av1_filter_intra_taps[mode] + 3);
    taps_4_5[0] = *(longlong *)(av1_filter_intra_taps[mode] + 4);
    taps_4_5[1] = *(longlong *)(av1_filter_intra_taps[mode] + 5);
    taps_6_7[0] = *(longlong *)(av1_filter_intra_taps[mode] + 6);
    taps_6_7[1] = *(longlong *)(av1_filter_intra_taps[mode] + 7);
    if ((0x4041UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)left;
    }
    else {
      auVar15 = ZEXT416(*(uint *)left);
    }
    local_118._0_8_ = auVar15._0_8_ << 0x28;
    local_118._8_8_ = auVar15._8_8_ << 0x28 | auVar15._0_8_ >> 0x18;
    auVar15 = ZEXT516(*(uint5 *)(above + -1)) | local_118;
    local_128[0] = auVar15._0_8_;
    local_128[1]._0_4_ = auVar15._0_4_;
    local_128[1]._4_4_ = auVar15._4_4_;
    filter_4x2_sse4_1(dst,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
    local_128 = (__m128i)pshufb(ZEXT416(*(uint *)(dst + stride)) | local_118,_DAT_004bb770);
    filter_4x2_sse4_1(dst + stride * 2,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
    puVar13 = (uint *)(dst + stride * 2 + stride);
    if ((0x42484UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
      if ((0x7bfbeUL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
        return;
      }
    }
    else {
      auVar16._0_8_ = local_118._0_8_ << 8;
      auVar16._8_8_ = local_118._8_8_ << 8 | (ulong)local_118._0_8_ >> 0x38;
      local_128 = (__m128i)pshufb(ZEXT416(*puVar13) | auVar16,_DAT_004bb780);
      puVar12 = (uint8_t *)((long)puVar13 + stride);
      local_118 = auVar16;
      filter_4x2_sse4_1(puVar12,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
      auVar15 = local_118;
      uVar10 = *(ulong *)(left + 8);
      auVar16 = pshufb(ZEXT416(*(uint *)(puVar12 + stride)),_DAT_004bb780);
      auVar17 = pshufb(local_118,_DAT_004bb790);
      local_128 = (__m128i)(auVar17 | auVar16);
      lVar9 = stride * 2;
      puVar12 = puVar12 + lVar9;
      filter_4x2_sse4_1(puVar12,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
      local_88 = auVar15._8_8_ >> 0x28;
      auVar18._0_8_ = local_88 << 0x30;
      auVar18._8_8_ = auVar15._8_8_ >> 0x38;
      auVar17._0_8_ = uVar10 << 0x38;
      auVar17._8_8_ = uVar10 >> 8;
      auVar17 = auVar17 | auVar18;
      local_128 = (__m128i)pshufb(ZEXT416(*(uint *)(puVar12 + stride)) | auVar17,_DAT_004bb770);
      puVar12 = puVar12 + lVar9;
      filter_4x2_sse4_1(puVar12,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
      local_128 = (__m128i)pshufb(ZEXT416(*(uint *)(puVar12 + stride)) | auVar17 >> 0x10,
                                  _DAT_004bb770);
      filter_4x2_sse4_1(puVar12 + lVar9,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
      puVar13 = (uint *)(puVar12 + lVar9 + stride);
      uStack_d0 = auVar17._8_8_ >> 0x10;
      local_118._8_8_ = uStack_d0;
    }
    local_118._0_8_ = local_118._8_8_ << 0x30;
    local_118._8_8_ = (ulong)local_118._8_8_ >> 0x10;
    local_128 = (__m128i)pshufb(ZEXT416(*puVar13) | local_118,_DAT_004bb770);
    puVar12 = (uint8_t *)((long)puVar13 + stride);
    filter_4x2_sse4_1(puVar12,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7);
    auVar15 = pshufb(ZEXT416(*(uint *)(puVar12 + stride)),_DAT_004bb7a0);
    auVar16 = pshufb(local_118,_DAT_004bb7b0);
    local_128 = (__m128i)(auVar16 | auVar15);
    filter_4x2_sse4_1(puVar12 + stride * 2,stride,&local_128,&taps_0_1,&taps_2_3,&taps_4_5,&taps_6_7
                     );
  }
  return;
}

Assistant:

void av1_filter_intra_predictor_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                       TX_SIZE tx_size, const uint8_t *above,
                                       const uint8_t *left, int mode) {
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  filter_intra_predictor_sse4_1(dst, stride, above, left, mode, bw, bh);
}